

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall
HomExtDirFill::operator()
          (HomExtDirFill *this,IntVect *iv,Array4<double> *dest,int dcomp,int numcomp,
          GeometryData *geom,Real param_6,BCRec *bcr,int param_8,int param_9)

{
  double *pdVar1;
  int *piVar2;
  int idir;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  if (0 < numcomp) {
    piVar2 = bcr->bc + 3;
    uVar5 = 0;
    do {
      lVar3 = ((long)iv->vect[1] - (long)(dest->begin).y) * dest->jstride;
      lVar8 = ((long)iv->vect[2] - (long)(dest->begin).z) * dest->kstride;
      lVar6 = (uVar5 + (long)dcomp) * dest->nstride;
      pdVar1 = dest->p;
      lVar7 = (long)iv->vect[0] - (long)(dest->begin).x;
      lVar4 = 0;
      do {
        if ((piVar2[lVar4 + -3] == 3) && (iv->vect[lVar4] < (geom->domain).smallend.vect[lVar4])) {
          pdVar1[lVar3 + lVar7 + lVar8 + lVar6] = 0.0;
        }
        if ((piVar2[lVar4] == 3) && ((geom->domain).bigend.vect[lVar4] < iv->vect[lVar4])) {
          pdVar1[lVar3 + lVar7 + lVar8 + lVar6] = 0.0;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      uVar5 = uVar5 + 1;
      piVar2 = piVar2 + 6;
    } while (uVar5 != (uint)numcomp);
  }
  return;
}

Assistant:

AMREX_GPU_DEVICE
    void operator() (const IntVect& iv, Array4<Real> const& dest,
                     const int dcomp, const int numcomp,
                     GeometryData const& geom, const Real /*time*/,
                     const BCRec* bcr, const int /*bcomp*/,
                     const int /*orig_comp*/) const
    {
       const int* domlo = geom.Domain().loVect();
       const int* domhi = geom.Domain().hiVect();
       for (int n = 0; n < numcomp; n++ ) {
          const int* bc = bcr[n].data();
          for (int idir = 0; idir < AMREX_SPACEDIM; idir++) {
             if ((bc[idir] == amrex::BCType::ext_dir) and (iv[idir] < domlo[idir])) {
                dest(iv, dcomp+n) = 0.0;
             }
             if ((bc[idir + AMREX_SPACEDIM] == amrex::BCType::ext_dir) and (iv[idir] > domhi[idir])) {
                dest(iv, dcomp+n) = 0.0;
             }
          }
       }
    }